

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O1

size_t rtc::html_decode(char *buffer,size_t buflen,char *source,size_t srclen)

{
  size_t sVar1;
  ostream *poVar2;
  FatalMessage local_180;
  
  if (buffer != (char *)0x0) {
    sVar1 = xml_decode(buffer,buflen,source,srclen);
    return sVar1;
  }
  FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/stringencode.cc"
             ,0x139);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_180,"Check failed: buffer",0x14);
  std::ios::widen((char)(ostream *)&local_180 + (char)*(undefined8 *)(local_180._0_8_ + -0x18));
  std::ostream::put((char)&local_180);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
  FatalMessage::~FatalMessage(&local_180);
}

Assistant:

size_t html_decode(char * buffer, size_t buflen,
                   const char * source, size_t srclen) {
  RTC_DCHECK(buffer);  // TODO(grunell): estimate output size
  return xml_decode(buffer, buflen, source, srclen);
}